

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O2

unsigned_long __thiscall NanoVM::pop<unsigned_long>(NanoVM *this)

{
  ulong uVar1;
  uint64_t uVar2;
  unsigned_long uVar3;
  
  uVar2 = (this->cpu).registers[7];
  uVar1 = uVar2 - 8;
  if (uVar1 < (this->cpu).codeSize) {
    this->errorFlag = 0x80;
    return 0;
  }
  uVar3 = *(unsigned_long *)((this->cpu).codeBase + (uVar2 - 8));
  (this->cpu).registers[7] = uVar1;
  return uVar3;
}

Assistant:

inline T NanoVM::pop() {
	// Check bounds
	if (cpu.registers[esp] - sizeof(T) < cpu.codeSize) {
		// Reached the bottom of stack
		errorFlag = STACK_ERROR;
		return 0;
	}
	// pop value from stack
	T value = *reinterpret_cast<T*>(cpu.codeBase + cpu.registers[esp] - sizeof(T));
	// update esp
	cpu.registers[esp] -= sizeof(value);
	return value;
}